

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  ushort uVar1;
  stbi_uc *psVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  stbi_uc *psVar15;
  stbi_uc sVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  stbi__uint32 sVar21;
  char *zout;
  int iVar22;
  uint uVar23;
  int iVar24;
  ulong unaff_R15;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001018b4:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      if (a->num_bits < 1) {
        uVar17 = a->code_buffer;
        pbVar12 = a->zbuffer;
        iVar9 = a->num_bits;
        do {
          uVar7 = 0;
          pbVar13 = pbVar12;
          if (pbVar12 < a->zbuffer_end) {
            pbVar13 = pbVar12 + 1;
            a->zbuffer = pbVar13;
            uVar7 = (uint)*pbVar12;
          }
          uVar17 = uVar17 | uVar7 << ((byte)iVar9 & 0x1f);
          a->code_buffer = uVar17;
          a->num_bits = iVar9 + 8;
          bVar3 = iVar9 < 0x11;
          pbVar12 = pbVar13;
          iVar9 = iVar9 + 8;
        } while (bVar3);
      }
      iVar4 = a->num_bits;
      uVar17 = a->code_buffer;
      uVar7 = uVar17 >> 1;
      a->code_buffer = uVar7;
      iVar9 = iVar4 + -1;
      a->num_bits = iVar9;
      if (iVar4 < 3) {
        pbVar12 = a->zbuffer;
        do {
          uVar8 = 0;
          pbVar13 = pbVar12;
          if (pbVar12 < a->zbuffer_end) {
            pbVar13 = pbVar12 + 1;
            a->zbuffer = pbVar13;
            uVar8 = (uint)*pbVar12;
          }
          uVar7 = uVar7 | uVar8 << ((byte)iVar9 & 0x1f);
          a->code_buffer = uVar7;
          a->num_bits = iVar9 + 8;
          bVar3 = iVar9 < 0x11;
          pbVar12 = pbVar13;
          iVar9 = iVar9 + 8;
        } while (bVar3);
      }
      iVar9 = a->num_bits;
      uVar7 = a->code_buffer;
      uVar10 = uVar7 >> 2;
      a->code_buffer = uVar10;
      uVar8 = iVar9 - 2;
      a->num_bits = uVar8;
      switch(uVar7 & 3) {
      case 0:
        uVar7 = uVar8 & 7;
        if (uVar7 != 0) {
          if (iVar9 < 2) {
            pbVar12 = a->zbuffer;
            do {
              uVar23 = 0;
              pbVar13 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar13 = pbVar12 + 1;
                a->zbuffer = pbVar13;
                uVar23 = (uint)*pbVar12;
              }
              uVar10 = uVar10 | uVar23 << ((byte)uVar8 & 0x1f);
              a->code_buffer = uVar10;
              a->num_bits = uVar8 + 8;
              bVar3 = (int)uVar8 < 0x11;
              pbVar12 = pbVar13;
              uVar8 = uVar8 + 8;
            } while (bVar3);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar7;
          a->num_bits = a->num_bits - uVar7;
        }
        if (a->num_bits < 1) {
          uVar20 = 0;
        }
        else {
          uVar7 = a->code_buffer;
          uVar20 = 0;
          iVar9 = a->num_bits;
          do {
            *(char *)((long)local_814.fast + uVar20) = (char)uVar7;
            uVar20 = uVar20 + 1;
            uVar7 = uVar7 >> 8;
            iVar4 = iVar9 + -8;
            bVar3 = 8 < iVar9;
            iVar9 = iVar4;
          } while (bVar3);
          a->code_buffer = uVar7;
          a->num_bits = iVar4;
        }
        if ((uint)uVar20 < 4) {
          psVar15 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          uVar20 = uVar20 & 0xffffffff;
          do {
            if (psVar15 < psVar2) {
              a->zbuffer = psVar15 + 1;
              sVar16 = *psVar15;
              psVar15 = psVar15 + 1;
            }
            else {
              sVar16 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar20) = sVar16;
            uVar20 = uVar20 + 1;
          } while (uVar20 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          unaff_R15 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + unaff_R15) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + unaff_R15 <= a->zout_end) ||
                  (iVar9 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar9 != 0)) {
            memcpy(a->zout,a->zbuffer,unaff_R15);
            a->zbuffer = a->zbuffer + unaff_R15;
            a->zout = a->zout + unaff_R15;
            goto LAB_001023e6;
          }
        }
        else {
          stbi__g_failure_reason = "zlib corrupt";
        }
        goto switchD_0010197f_caseD_3;
      case 1:
        iVar9 = stbi__zbuild_huffman
                          (&a->z_length,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar9 == 0) goto switchD_0010197f_caseD_3;
        iVar9 = stbi__zbuild_huffman
                          (&a->z_distance,
                           "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                           ,0x20);
        break;
      case 2:
        if (iVar9 < 7) {
          pbVar12 = a->zbuffer;
          do {
            uVar7 = 0;
            pbVar13 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar13 = pbVar12 + 1;
              a->zbuffer = pbVar13;
              uVar7 = (uint)*pbVar12;
            }
            uVar10 = uVar10 | uVar7 << ((byte)uVar8 & 0x1f);
            a->code_buffer = uVar10;
            a->num_bits = uVar8 + 8;
            bVar3 = (int)uVar8 < 0x11;
            pbVar12 = pbVar13;
            uVar8 = uVar8 + 8;
          } while (bVar3);
        }
        iVar4 = a->num_bits;
        uVar7 = a->code_buffer;
        uVar8 = uVar7 >> 5;
        a->code_buffer = uVar8;
        iVar9 = iVar4 + -5;
        a->num_bits = iVar9;
        if (iVar4 < 10) {
          pbVar12 = a->zbuffer;
          do {
            uVar10 = 0;
            pbVar13 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar13 = pbVar12 + 1;
              a->zbuffer = pbVar13;
              uVar10 = (uint)*pbVar12;
            }
            uVar8 = uVar8 | uVar10 << ((byte)iVar9 & 0x1f);
            a->code_buffer = uVar8;
            a->num_bits = iVar9 + 8;
            bVar3 = iVar9 < 0x11;
            pbVar12 = pbVar13;
            iVar9 = iVar9 + 8;
          } while (bVar3);
        }
        iVar4 = a->num_bits;
        uVar8 = a->code_buffer;
        uVar10 = uVar8 >> 5;
        a->code_buffer = uVar10;
        iVar9 = iVar4 + -5;
        a->num_bits = iVar9;
        if (iVar4 < 9) {
          pbVar12 = a->zbuffer;
          do {
            uVar23 = 0;
            pbVar13 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar13 = pbVar12 + 1;
              a->zbuffer = pbVar13;
              uVar23 = (uint)*pbVar12;
            }
            uVar10 = uVar10 | uVar23 << ((byte)iVar9 & 0x1f);
            a->code_buffer = uVar10;
            a->num_bits = iVar9 + 8;
            bVar3 = iVar9 < 0x11;
            pbVar12 = pbVar13;
            iVar9 = iVar9 + 8;
          } while (bVar3);
        }
        uVar7 = uVar7 & 0x1f;
        iVar4 = uVar7 + 0x101;
        uVar23 = (uVar8 & 0x1f) + 1;
        unaff_R15 = (ulong)uVar23;
        uVar8 = a->code_buffer;
        uVar10 = uVar8 >> 4;
        a->code_buffer = uVar10;
        iVar9 = a->num_bits + -4;
        a->num_bits = iVar9;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        lVar19 = 0;
        do {
          uVar11 = uVar10;
          if (iVar9 < 3) {
            pbVar12 = a->zbuffer;
            iVar22 = iVar9;
            do {
              uVar10 = 0;
              pbVar13 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar13 = pbVar12 + 1;
                a->zbuffer = pbVar13;
                uVar10 = (uint)*pbVar12;
              }
              uVar11 = uVar11 | uVar10 << ((byte)iVar22 & 0x1f);
              a->code_buffer = uVar11;
              iVar9 = iVar22 + 8;
              a->num_bits = iVar9;
              bVar3 = iVar22 < 0x11;
              pbVar12 = pbVar13;
              iVar22 = iVar9;
            } while (bVar3);
          }
          uVar10 = uVar11 >> 3;
          a->code_buffer = uVar10;
          iVar9 = iVar9 + -3;
          a->num_bits = iVar9;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar19]
                   ) = (byte)uVar11 & 7;
          lVar19 = lVar19 + 1;
        } while (lVar19 != (ulong)(uVar8 & 0xf) + 4);
        iVar9 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar9 == 0) goto switchD_0010197f_caseD_3;
        iVar22 = uVar23 + iVar4;
        uVar8 = a->num_bits;
        uVar10 = a->code_buffer;
        iVar9 = 0;
        while( true ) {
          if (iVar22 <= iVar9) break;
          if ((int)uVar8 < 0x10) {
            pbVar12 = a->zbuffer;
            uVar11 = uVar8;
            do {
              uVar8 = 0;
              pbVar13 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar13 = pbVar12 + 1;
                a->zbuffer = pbVar13;
                uVar8 = (uint)*pbVar12;
              }
              uVar10 = uVar10 | uVar8 << ((byte)uVar11 & 0x1f);
              a->code_buffer = uVar10;
              uVar8 = uVar11 + 8;
              a->num_bits = uVar8;
              bVar3 = (int)uVar11 < 0x11;
              pbVar12 = pbVar13;
              uVar11 = uVar8;
            } while (bVar3);
          }
          unaff_R15 = (ulong)uVar8;
          uVar6 = local_814.fast[uVar10 & 0x1ff];
          if (uVar6 == 0) {
            uVar6 = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
            uVar11 = (uVar6 & 0xf0f) << 4 | uVar6 >> 4 & 0xf0f;
            uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4;
            uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2;
            lVar19 = 0;
            do {
              lVar14 = lVar19;
              lVar19 = lVar14 + 1;
            } while (local_814.maxcode[lVar14 + 10] <= (int)uVar11);
            uVar18 = 0xffffffff;
            if (lVar19 != 7) {
              uVar6 = local_814.firstcode[lVar14 + 10];
              uVar1 = local_814.firstsymbol[lVar14 + 10];
              uVar10 = uVar10 >> ((char)lVar14 + 10U & 0x1f);
              a->code_buffer = uVar10;
              uVar8 = (uVar8 - (int)lVar19) - 9;
              unaff_R15 = (ulong)uVar8;
              a->num_bits = uVar8;
              uVar18 = (uint)*(ushort *)
                              ((long)&local_814 +
                              ((ulong)uVar1 +
                              ((ulong)(uVar11 >> (7U - (char)lVar19 & 0x1f)) - (ulong)uVar6)) * 2 +
                              0x5a4);
            }
          }
          else {
            uVar10 = uVar10 >> ((byte)(uVar6 >> 9) & 0x1f);
            a->code_buffer = uVar10;
            uVar8 = uVar8 - (uVar6 >> 9);
            unaff_R15 = (ulong)uVar8;
            a->num_bits = uVar8;
            uVar18 = uVar6 & 0x1ff;
          }
          if (uVar18 < 0x13) {
            if ((int)uVar18 < 0x10) {
              lVar19 = (long)iVar9;
              iVar9 = iVar9 + 1;
              abStack_9e9[lVar19 + 1] = (char)uVar18;
              bVar3 = true;
            }
            else {
              uVar8 = (uint)unaff_R15;
              if (uVar18 == 0x11) {
                if ((int)uVar8 < 3) {
                  pbVar12 = a->zbuffer;
                  do {
                    uVar8 = 0;
                    pbVar13 = pbVar12;
                    if (pbVar12 < a->zbuffer_end) {
                      pbVar13 = pbVar12 + 1;
                      a->zbuffer = pbVar13;
                      uVar8 = (uint)*pbVar12;
                    }
                    iVar24 = (int)unaff_R15;
                    uVar10 = uVar10 | uVar8 << ((byte)unaff_R15 & 0x1f);
                    a->code_buffer = uVar10;
                    uVar8 = iVar24 + 8;
                    a->num_bits = uVar8;
                    unaff_R15 = (ulong)uVar8;
                    pbVar12 = pbVar13;
                  } while (iVar24 < 0x11);
                }
                uVar18 = uVar10 >> 3;
                a->code_buffer = uVar18;
                uVar8 = uVar8 - 3;
                a->num_bits = uVar8;
                uVar11 = (uVar10 & 7) + 3;
LAB_00101e87:
                unaff_R15 = (ulong)uVar8;
                bVar5 = 0;
              }
              else {
                if (uVar18 != 0x10) {
                  if ((int)uVar8 < 7) {
                    pbVar12 = a->zbuffer;
                    do {
                      uVar8 = 0;
                      pbVar13 = pbVar12;
                      if (pbVar12 < a->zbuffer_end) {
                        pbVar13 = pbVar12 + 1;
                        a->zbuffer = pbVar13;
                        uVar8 = (uint)*pbVar12;
                      }
                      iVar24 = (int)unaff_R15;
                      uVar10 = uVar10 | uVar8 << ((byte)unaff_R15 & 0x1f);
                      a->code_buffer = uVar10;
                      uVar8 = iVar24 + 8;
                      a->num_bits = uVar8;
                      unaff_R15 = (ulong)uVar8;
                      pbVar12 = pbVar13;
                    } while (iVar24 < 0x11);
                  }
                  uVar18 = uVar10 >> 7;
                  a->code_buffer = uVar18;
                  uVar8 = uVar8 - 7;
                  a->num_bits = uVar8;
                  uVar11 = (uVar10 & 0x7f) + 0xb;
                  goto LAB_00101e87;
                }
                if ((int)uVar8 < 2) {
                  pbVar12 = a->zbuffer;
                  do {
                    uVar8 = 0;
                    pbVar13 = pbVar12;
                    if (pbVar12 < a->zbuffer_end) {
                      pbVar13 = pbVar12 + 1;
                      a->zbuffer = pbVar13;
                      uVar8 = (uint)*pbVar12;
                    }
                    iVar24 = (int)unaff_R15;
                    uVar10 = uVar10 | uVar8 << ((byte)unaff_R15 & 0x1f);
                    a->code_buffer = uVar10;
                    uVar8 = iVar24 + 8;
                    a->num_bits = uVar8;
                    unaff_R15 = (ulong)uVar8;
                    pbVar12 = pbVar13;
                  } while (iVar24 < 0x11);
                }
                uVar18 = uVar10 >> 2;
                a->code_buffer = uVar18;
                unaff_R15 = (ulong)(uVar8 - 2);
                a->num_bits = uVar8 - 2;
                if (iVar9 == 0) {
                  stbi__g_failure_reason = "bad codelengths";
                  iVar9 = 0;
                  bVar3 = false;
                  uVar10 = uVar18;
                  goto LAB_00101ec8;
                }
                uVar11 = (uVar10 & 3) + 3;
                bVar5 = abStack_9e9[iVar9];
              }
              bVar3 = (int)uVar11 <= iVar22 - iVar9;
              uVar10 = uVar18;
              if (bVar3) {
                memset(abStack_9e9 + (long)iVar9 + 1,(uint)bVar5,(ulong)uVar11);
                iVar9 = iVar9 + uVar11;
              }
              else {
                stbi__g_failure_reason = "bad codelengths";
              }
            }
          }
          else {
            stbi__g_failure_reason = "bad codelengths";
            bVar3 = false;
          }
LAB_00101ec8:
          uVar8 = (uint)unaff_R15;
          if (!bVar3) goto switchD_0010197f_caseD_3;
        }
        if (iVar22 != iVar9) {
          stbi__g_failure_reason = "bad codelengths";
          goto switchD_0010197f_caseD_3;
        }
        iVar9 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar4);
        if (iVar9 == 0) goto switchD_0010197f_caseD_3;
        iVar9 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar7,uVar23);
        break;
      case 3:
        goto switchD_0010197f_caseD_3;
      }
      if (iVar9 == 0) goto switchD_0010197f_caseD_3;
      zout = a->zout;
      do {
        if (a->num_bits < 0x10) {
          uVar7 = a->code_buffer;
          pbVar12 = a->zbuffer;
          iVar9 = a->num_bits;
          do {
            uVar8 = 0;
            pbVar13 = pbVar12;
            if (pbVar12 < a->zbuffer_end) {
              pbVar13 = pbVar12 + 1;
              a->zbuffer = pbVar13;
              uVar8 = (uint)*pbVar12;
            }
            uVar7 = uVar7 | uVar8 << ((byte)iVar9 & 0x1f);
            a->code_buffer = uVar7;
            a->num_bits = iVar9 + 8;
            bVar3 = iVar9 < 0x11;
            pbVar12 = pbVar13;
            iVar9 = iVar9 + 8;
          } while (bVar3);
        }
        uVar7 = a->code_buffer;
        uVar6 = (a->z_length).fast[uVar7 & 0x1ff];
        if (uVar6 == 0) {
          uVar6 = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
          uVar8 = (uVar6 & 0xf0f) << 4 | (uVar6 & 0xf0f0) >> 4;
          uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333) * 4;
          uVar8 = (uVar8 >> 1 & 0x5555) + (uVar8 & 0x5555) * 2;
          lVar19 = 0;
          do {
            lVar14 = lVar19;
            lVar19 = lVar14 + 1;
          } while ((a->z_length).maxcode[lVar14 + 10] <= (int)uVar8);
          uVar10 = 0xffffffff;
          if (lVar19 != 7) {
            uVar6 = (a->z_length).firstcode[lVar14 + 10];
            uVar1 = (a->z_length).firstsymbol[lVar14 + 10];
            a->code_buffer = uVar7 >> ((char)lVar14 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar19) + -9;
            uVar10 = (uint)*(ushort *)
                            ((long)a +
                            ((ulong)uVar1 +
                            ((ulong)(uVar8 >> (7U - (char)lVar19 & 0x1f)) - (ulong)uVar6)) * 2 +
                            0x5d8);
          }
        }
        else {
          a->code_buffer = uVar7 >> ((byte)(uVar6 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar6 >> 9);
          uVar10 = uVar6 & 0x1ff;
        }
        if ((int)uVar10 < 0x100) {
          if ((int)uVar10 < 0) {
LAB_001022a4:
            stbi__g_failure_reason = "bad huffman code";
LAB_001022b2:
            bVar3 = false;
            unaff_R15 = 0;
          }
          else {
            if (a->zout_end <= zout) {
              iVar9 = stbi__zexpand(a,zout,1);
              if (iVar9 == 0) goto LAB_001022b2;
              zout = a->zout;
            }
            *zout = (char)uVar10;
            zout = zout + 1;
            bVar3 = true;
          }
        }
        else if (uVar10 == 0x100) {
          a->zout = zout;
          unaff_R15 = 1;
          bVar3 = false;
        }
        else {
          uVar20 = (ulong)(uVar10 - 0x101);
          uVar7 = stbi__zlength_base[uVar20];
          if (0xffffffffffffffeb < uVar20 - 0x1c) {
            iVar9 = stbi__zlength_extra[uVar20];
            if (a->num_bits < iVar9) {
              uVar8 = a->code_buffer;
              pbVar12 = a->zbuffer;
              iVar4 = a->num_bits;
              do {
                uVar10 = 0;
                pbVar13 = pbVar12;
                if (pbVar12 < a->zbuffer_end) {
                  pbVar13 = pbVar12 + 1;
                  a->zbuffer = pbVar13;
                  uVar10 = (uint)*pbVar12;
                }
                uVar8 = uVar8 | uVar10 << ((byte)iVar4 & 0x1f);
                a->code_buffer = uVar8;
                a->num_bits = iVar4 + 8;
                bVar3 = iVar4 < 0x11;
                pbVar12 = pbVar13;
                iVar4 = iVar4 + 8;
              } while (bVar3);
            }
            uVar8 = a->code_buffer;
            a->code_buffer = uVar8 >> ((byte)iVar9 & 0x1f);
            a->num_bits = a->num_bits - iVar9;
            uVar7 = uVar7 + (~(-1 << ((byte)iVar9 & 0x1f)) & uVar8);
          }
          if (a->num_bits < 0x10) {
            uVar8 = a->code_buffer;
            pbVar12 = a->zbuffer;
            iVar9 = a->num_bits;
            do {
              uVar10 = 0;
              pbVar13 = pbVar12;
              if (pbVar12 < a->zbuffer_end) {
                pbVar13 = pbVar12 + 1;
                a->zbuffer = pbVar13;
                uVar10 = (uint)*pbVar12;
              }
              uVar8 = uVar8 | uVar10 << ((byte)iVar9 & 0x1f);
              a->code_buffer = uVar8;
              a->num_bits = iVar9 + 8;
              bVar3 = iVar9 < 0x11;
              pbVar12 = pbVar13;
              iVar9 = iVar9 + 8;
            } while (bVar3);
          }
          uVar8 = a->code_buffer;
          uVar6 = (a->z_distance).fast[uVar8 & 0x1ff];
          if (uVar6 == 0) {
            uVar6 = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
            uVar10 = (uVar6 & 0xf0f) << 4 | (uVar6 & 0xf0f0) >> 4;
            uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
            uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
            lVar19 = 0;
            do {
              lVar14 = lVar19;
              lVar19 = lVar14 + 1;
            } while ((a->z_distance).maxcode[lVar14 + 10] <= (int)uVar10);
            uVar20 = 0xffffffff;
            if (lVar19 != 7) {
              uVar6 = (a->z_distance).firstcode[lVar14 + 10];
              uVar1 = (a->z_distance).firstsymbol[lVar14 + 10];
              a->code_buffer = uVar8 >> ((char)lVar14 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar19) + -9;
              uVar20 = (ulong)*(ushort *)
                               ((long)a +
                               ((ulong)uVar1 +
                               ((ulong)(uVar10 >> (7U - (char)lVar19 & 0x1f)) - (ulong)uVar6)) * 2 +
                               0xdbc);
            }
          }
          else {
            a->code_buffer = uVar8 >> ((byte)(uVar6 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar6 >> 9);
            uVar20 = (ulong)(uVar6 & 0x1ff);
          }
          if ((int)uVar20 < 0) goto LAB_001022a4;
          iVar9 = stbi__zdist_base[uVar20];
          if (0xffffffffffffffe5 < uVar20 - 0x1e) {
            iVar4 = stbi__zdist_extra[uVar20];
            if (a->num_bits < iVar4) {
              sVar21 = a->code_buffer;
              pbVar12 = a->zbuffer;
              iVar22 = a->num_bits;
              do {
                uVar8 = 0;
                pbVar13 = pbVar12;
                if (pbVar12 < a->zbuffer_end) {
                  pbVar13 = pbVar12 + 1;
                  a->zbuffer = pbVar13;
                  uVar8 = (uint)*pbVar12;
                }
                sVar21 = sVar21 | uVar8 << ((byte)iVar22 & 0x1f);
                a->code_buffer = sVar21;
                a->num_bits = iVar22 + 8;
                bVar3 = iVar22 < 0x11;
                pbVar12 = pbVar13;
                iVar22 = iVar22 + 8;
              } while (bVar3);
            }
            uVar8 = a->code_buffer;
            a->code_buffer = uVar8 >> ((byte)iVar4 & 0x1f);
            a->num_bits = a->num_bits - iVar4;
            iVar9 = iVar9 + (~(-1 << ((byte)iVar4 & 0x1f)) & uVar8);
          }
          if ((long)zout - (long)a->zout_start < (long)iVar9) {
            stbi__g_failure_reason = "bad dist";
LAB_00102297:
            bVar3 = false;
            unaff_R15 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar7) {
              iVar4 = stbi__zexpand(a,zout,uVar7);
              if (iVar4 == 0) goto LAB_00102297;
              zout = a->zout;
            }
            lVar19 = -(long)iVar9;
            bVar3 = true;
            if (iVar9 == 1) {
              if (uVar7 != 0) {
                memset(zout,(uint)(byte)zout[lVar19],(ulong)uVar7);
                zout = zout + (ulong)(uVar7 - 1) + 1;
              }
            }
            else {
              for (; uVar7 != 0; uVar7 = uVar7 - 1) {
                *zout = zout[lVar19];
                zout = zout + 1;
              }
            }
          }
        }
      } while (bVar3);
      if ((int)unaff_R15 == 0) {
        return 0;
      }
LAB_001023e6:
    } while ((uVar17 & 1) == 0);
    iVar9 = 1;
  }
  else {
    pbVar12 = a->zbuffer;
    uVar7 = 0;
    uVar17 = 0;
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar17 = (uint)*pbVar12;
    }
    pbVar12 = a->zbuffer;
    if (pbVar12 < a->zbuffer_end) {
      a->zbuffer = pbVar12 + 1;
      uVar7 = (uint)*pbVar12;
    }
    if ((uVar17 << 8 | uVar7) * -0x42108421 < 0x8421085) {
      if ((uVar7 & 0x20) == 0) {
        if ((uVar17 & 0xf) == 8) goto LAB_001018b4;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
switchD_0010197f_caseD_3:
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}